

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::MatteMaterial::writeTo(MatteMaterial *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  SP *in_RDI;
  BinaryWriter *in_stack_ffffffffffffff48;
  BinaryWriter *in_stack_ffffffffffffff50;
  BinaryWriter *this_00;
  
  Material::writeTo((Material *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this_00 = in_RSI;
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff50,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff48);
  BinaryWriter::serialize(this_00,in_RDI);
  BinaryWriter::write<int>(in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x12474a);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_ffffffffffffff50,(vec3f *)in_stack_ffffffffffffff48);
  BinaryWriter::write<float>(in_stack_ffffffffffffff50,(float *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff50,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff48);
  BinaryWriter::serialize(this_00,in_RDI);
  BinaryWriter::write<int>(in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x1247d9);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_RSI,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff48);
  BinaryWriter::serialize(this_00,in_RDI);
  BinaryWriter::write<int>(in_RSI,(int *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x124836);
  return 0x10;
}

Assistant:

int MatteMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(binary.serialize(map_kd));
    binary.write(kd);
    binary.write(sigma);
    binary.write(binary.serialize(map_sigma));
    binary.write(binary.serialize(map_bump));
    return TYPE_MATTE_MATERIAL;
  }